

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O3

int dlep_radio_interface_init(void)

{
  oonf_class_add(&_interface_class);
  dlep_extension_init();
  dlep_session_init();
  dlep_radio_session_init();
  dlep_base_proto_radio_init();
  dlep_base_ip_init();
  dlep_base_metric_init();
  dlep_l1_statistics_init();
  dlep_l2_statistics_init();
  dlep_radio_attributes_init();
  dlep_lid_init();
  return 0;
}

Assistant:

int
dlep_radio_interface_init(void) {
  oonf_class_add(&_interface_class);

  dlep_extension_init();
  dlep_session_init();
  dlep_radio_session_init();
  dlep_base_proto_radio_init();
  dlep_base_ip_init();
  dlep_base_metric_init();
  dlep_l1_statistics_init();
  dlep_l2_statistics_init();
  dlep_radio_attributes_init();
  dlep_lid_init();

  _shutting_down = false;
  return 0;
}